

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewClass::Update(DataViewClass *this,DataModel *model)

{
  bool bVar1;
  bool bVar2;
  Element *element;
  DataExpression *this_00;
  String *class_name;
  Variant variant;
  DataExpressionInterface expr_interface;
  Variant local_60;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_60);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_38,&local_60);
    if (bVar1) {
      bVar1 = Variant::Get<bool>(&local_60,false);
      class_name = &(this->super_DataViewCommon).modifier;
      bVar2 = Element::IsClassSet(element,class_name);
      if (bVar1 != bVar2) {
        bVar2 = true;
        Element::SetClass(element,class_name,bVar1);
        goto LAB_0026ec7f;
      }
    }
  }
  bVar2 = false;
LAB_0026ec7f:
  Variant::~Variant(&local_60);
  return bVar2;
}

Assistant:

bool DataViewClass::Update(DataModel& model)
{
	const String& class_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool activate = variant.Get<bool>();
		const bool is_set = element->IsClassSet(class_name);
		if (activate != is_set)
		{
			element->SetClass(class_name, activate);
			result = true;
		}
	}
	return result;
}